

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infback.c
# Opt level: O0

int32_t zng_inflateBackEnd(zng_stream *strm)

{
  zng_stream *in_RDI;
  int32_t local_4;
  
  if (((in_RDI == (zng_stream *)0x0) || (in_RDI->state == (internal_state *)0x0)) ||
     (in_RDI->zfree == (free_func)0x0)) {
    local_4 = -2;
  }
  else {
    free_inflate(in_RDI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateBackEnd)(PREFIX3(stream) *strm) {
    if (strm == NULL || strm->state == NULL || strm->zfree == NULL)
        return Z_STREAM_ERROR;

    /* Free allocated buffers */
    free_inflate(strm);

    Tracev((stderr, "inflate: end\n"));
    return Z_OK;
}